

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O2

void __thiscall
MinVR::VRDisplayNode::auditValues
          (VRDisplayNode *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *valuesSet,string *treeData)

{
  VRDisplayNode *this_00;
  key_type *__k;
  string *treeData_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  iterator iVar1;
  ostream *poVar2;
  VRError *this_01;
  pointer ppVVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  allocator<char> local_1f3;
  allocator<char> local_1f2;
  allocator<char> local_1f1;
  VRDisplayNode *local_1f0;
  int local_1e4;
  string *local_1e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d8;
  _List_node_base *local_1d0;
  _Base_ptr local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  p_Var4 = (_List_node_base *)&this->_valuesAdded;
  local_1f0 = this;
  while (p_Var4 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)&this->_valuesAdded) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)valuesSet,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1));
  }
  p_Var4 = (_List_node_base *)&local_1f0->_valuesNeeded;
  local_1c8 = &(valuesSet->_M_t)._M_impl.super__Rb_tree_header._M_header;
  p_Var5 = p_Var4;
  local_1e0 = treeData;
  local_1d8 = &valuesSet->_M_t;
  local_1d0 = p_Var4;
  while( true ) {
    do {
      __x = local_1d8;
      treeData_00 = local_1e0;
      p_Var4 = (((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var4 == p_Var5) {
        for (ppVVar3 = (local_1f0->_children).
                       super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppVVar3 !=
            (local_1f0->_children).
            super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish; ppVVar3 = ppVVar3 + 1) {
          this_00 = *ppVVar3;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_Rb_tree(&local_60,__x);
          auditValues(this_00,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_60,treeData_00);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_60);
        }
        return;
      }
      __k = (key_type *)(p_Var4 + 1);
      iVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(local_1d8,__k);
    } while (iVar1._M_node != local_1c8);
    poVar2 = std::operator<<((ostream *)&std::cerr,"Missing value in display node tree:");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,(string *)local_1e0);
    std::endl<char,std::char_traits<char>>(poVar2);
    if (*(char *)&p_Var4[3]._M_next == '\x01') break;
    std::operator+(&local_120,"Optional data (",__k);
    std::operator+(&local_100,&local_120,") is not available to the ");
    (*local_1f0->_vptr_VRDisplayNode[2])(&local_140);
    std::operator+(&local_e0,&local_100,&local_140);
    std::operator+(&local_1c0,&local_e0," (");
    (*local_1f0->_vptr_VRDisplayNode[3])(&local_160);
    std::operator+(&local_80,&local_1c0,&local_160);
    std::operator+(&local_c0,&local_80,").");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,
               "Review the construction of the display node tree in your configuration file.",
               &local_1f1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/display/VRDisplayNode.cpp"
               ,&local_1f2);
    local_1e4 = 0x9e;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,
               "void MinVR::VRDisplayNode::auditValues(std::set<std::string>, const std::string &)",
               &local_1f3);
    VRError::VRWarning(&local_c0,&local_180,&local_1a0,&local_1e4,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    p_Var5 = local_1d0;
  }
  this_01 = (VRError *)__cxa_allocate_exception(0xa8);
  std::operator+(&local_120,"Necessary data (",__k);
  std::operator+(&local_100,&local_120,") is not available to the ");
  (*local_1f0->_vptr_VRDisplayNode[2])(&local_140);
  std::operator+(&local_e0,&local_100,&local_140);
  std::operator+(&local_1c0,&local_e0," (");
  (*local_1f0->_vptr_VRDisplayNode[3])(&local_160);
  std::operator+(&local_80,&local_1c0,&local_160);
  std::operator+(&local_c0,&local_80,").");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,
             "Review the construction of the display node tree in your configuration file.",
             &local_1f1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/display/VRDisplayNode.cpp"
             ,&local_1f2);
  local_1e4 = 0x9b;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "void MinVR::VRDisplayNode::auditValues(std::set<std::string>, const std::string &)",
             &local_1f3);
  VRError::VRError(this_01,&local_c0,&local_180,&local_1a0,&local_1e4,&local_a0);
  __cxa_throw(this_01,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

void VRDisplayNode::auditValues(std::set<std::string> valuesSet,
                                const std::string &treeData) {

  //std::cerr << " checking: " << _name << std::endl;

  // Add the values supplied by this node to the set of values against which we
  // will check the values needed by this node.
  for (std::list<std::string>::const_iterator it = _valuesAdded.begin();
       it != _valuesAdded.end(); it++) {

    //std:: cerr << "    adding: " << *it << std::endl;

    // Insert it added value into the set from above.
    valuesSet.insert(*it);
  }

  // Run through all the valuesNeeded and see if they are in valuesSet.
  for (std::list<std::pair<std::string, bool> >::const_iterator it = _valuesNeeded.begin();
       it != _valuesNeeded.end(); it++) {

    //std:: cerr << "    needing: " << it->first << std::endl;

    // If the name is not in the value set, print the treeData and throw an error.
    if (valuesSet.find(it->first) == valuesSet.end()) {

      std::cerr << "Missing value in display node tree:" << std::endl
                << treeData << std::endl;

      // We only bomb if the value is required.
      if (it->second) {
        VRERROR("Necessary data (" + it->first + ") is not available to the " + getName() + " (" + getType() + ").",
                "Review the construction of the display node tree in your configuration file.");
      } else {
        VRWARNING("Optional data (" + it->first + ") is not available to the " + getName() + " (" + getType() + ").",
                  "Review the construction of the display node tree in your configuration file.");
      }
    }
  }

  // Recursively audit the children nodes.
  for (std::vector<VRDisplayNode*>::const_iterator it = _children.begin();
       it != _children.end(); it++) {
    (*it)->auditValues(valuesSet, treeData);
  }
}